

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerator::ProcessResultT::reset(ProcessResultT *this)

{
  this->ExitStatus = 0;
  this->TermSignal = 0;
  if ((this->StdOut)._M_string_length != 0) {
    (this->StdOut)._M_string_length = 0;
    *(this->StdOut)._M_dataplus._M_p = '\0';
    std::__cxx11::string::reserve();
  }
  if ((this->StdErr)._M_string_length != 0) {
    (this->StdErr)._M_string_length = 0;
    *(this->StdErr)._M_dataplus._M_p = '\0';
    std::__cxx11::string::reserve();
  }
  if ((this->ErrorMessage)._M_string_length != 0) {
    (this->ErrorMessage)._M_string_length = 0;
    *(this->ErrorMessage)._M_dataplus._M_p = '\0';
    std::__cxx11::string::reserve();
  }
  return;
}

Assistant:

void cmQtAutoGenerator::ProcessResultT::reset()
{
  ExitStatus = 0;
  TermSignal = 0;
  if (!StdOut.empty()) {
    StdOut.clear();
    StdOut.shrink_to_fit();
  }
  if (!StdErr.empty()) {
    StdErr.clear();
    StdErr.shrink_to_fit();
  }
  if (!ErrorMessage.empty()) {
    ErrorMessage.clear();
    ErrorMessage.shrink_to_fit();
  }
}